

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O2

monster * monster_target_monster(effect_handler_context_t_conflict *context)

{
  wchar_t idx;
  monster *pmVar1;
  
  if ((((context->origin).what == SRC_MONSTER) &&
      (pmVar1 = cave_monster(cave,(context->origin).which.grid.x), pmVar1 != (monster *)0x0)) &&
     (idx = (pmVar1->target).midx, L'\0' < idx)) {
    pmVar1 = cave_monster(cave,idx);
    if (pmVar1 != (monster *)0x0) {
      return pmVar1;
    }
    __assert_fail("t_mon",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/effect-handler-general.c"
                  ,0x68,"struct monster *monster_target_monster(effect_handler_context_t *)");
  }
  return (monster *)0x0;
}

Assistant:

struct monster *monster_target_monster(effect_handler_context_t *context)
{
	if (context->origin.what == SRC_MONSTER) {
		struct monster *mon = cave_monster(cave, context->origin.which.monster);
		if (!mon) return NULL;
		if (mon->target.midx > 0) {
			struct monster *t_mon = cave_monster(cave, mon->target.midx);
			assert(t_mon);
			return t_mon;
		}
	}
	return NULL;
}